

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabel::changeEvent(QLabel *this,QEvent *ev)

{
  ushort uVar1;
  QLabelPrivate *this_00;
  QWidgetTextControl *this_01;
  QPalette *pal;
  QTextDocument *pQVar2;
  
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  uVar1 = *(ushort *)(ev + 8);
  if (uVar1 < 0x61) {
    if (uVar1 != 0x24) {
      if ((uVar1 == 0x27) &&
         (this_01 = (QWidgetTextControl *)this_00->control, this_01 != (QWidgetTextControl *)0x0)) {
        pal = QWidget::palette((QWidget *)this);
        QWidgetTextControl::setPalette(this_01,pal);
      }
      goto LAB_0041217a;
    }
LAB_00412147:
    if ((this_00->field_0x340 & 0x10) == 0) goto LAB_0041217a;
    if ((QWidgetTextControl *)this_00->control != (QWidgetTextControl *)0x0) {
      pQVar2 = QWidgetTextControl::document((QWidgetTextControl *)this_00->control);
      QTextDocument::setDefaultFont((QFont *)pQVar2);
    }
  }
  else if (uVar1 != 0xb2) {
    if (uVar1 != 0x61) goto LAB_0041217a;
    goto LAB_00412147;
  }
  QLabelPrivate::updateLabel(this_00);
LAB_0041217a:
  QFrame::changeEvent(&this->super_QFrame,ev);
  return;
}

Assistant:

void QLabel::changeEvent(QEvent *ev)
{
    Q_D(QLabel);
    if (ev->type() == QEvent::FontChange || ev->type() == QEvent::ApplicationFontChange) {
        if (d->isTextLabel) {
            if (d->control)
                d->control->document()->setDefaultFont(font());
            d->updateLabel();
        }
    } else if (ev->type() == QEvent::PaletteChange && d->control) {
        d->control->setPalette(palette());
    } else if (ev->type() == QEvent::ContentsRectChange) {
        d->updateLabel();
    }
    QFrame::changeEvent(ev);
}